

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O2

bool lexer_tester::test_file(string *filepath)

{
  char cVar1;
  __type _Var2;
  bool bVar3;
  tokenStream *this;
  istream *piVar4;
  size_type sVar5;
  Token *pTVar6;
  byte bVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  string line;
  string value;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string path_to_answers;
  string local_278;
  path p;
  ifstream current_stream;
  
  std::__cxx11::string::string((string *)&p,filepath);
  boost::filesystem::path::parent_path();
  std::operator+(&line,&type,"_answers/");
  boost::filesystem::path::stem();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &current_stream,&line,&value);
  std::operator+(&path_to_answers,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &current_stream,".txt");
  std::__cxx11::string::~string((string *)&current_stream);
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::string::~string((string *)&type);
  std::ifstream::ifstream(&current_stream);
  std::ifstream::open((string *)&current_stream,(_Ios_Openmode)&path_to_answers);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator+(&line,"Error: Cannot open ",&path_to_answers);
    print<std::__cxx11::string>(&line);
    std::__cxx11::string::~string((string *)&line);
    bVar3 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_278,filepath);
    this = lexer::parsefile(&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    file_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    file_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    file_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&current_stream,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      if (line._M_string_length != 0) {
        result.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        result.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        result.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                rfind(&line,',',0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&type,&line,0,(long)(int)sVar5);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&value,&line,(long)((sVar5 << 0x20) + 0x100000000) >> 0x20,0xffffffffffffffff);
        std::locale::locale((locale *)&local_2d8);
        boost::algorithm::trim<std::__cxx11::string>(&type,(locale *)&local_2d8);
        std::locale::~locale((locale *)&local_2d8);
        std::locale::locale((locale *)&local_2d8);
        boost::algorithm::trim<std::__cxx11::string>(&value,(locale *)&local_2d8);
        std::locale::~locale((locale *)&local_2d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&file_tokens,&value);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&file_tokens,&type);
        std::__cxx11::string::~string((string *)&value);
        std::__cxx11::string::~string((string *)&type);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&result);
      }
    }
    std::
    __reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (file_tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               file_tokens.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pTVar6 = tokenStream::getNext(this);
    type._M_dataplus._M_p = (pointer)&type.field_2;
    type._M_string_length = 0;
    value._M_dataplus._M_p = (pointer)&value.field_2;
    value._M_string_length = 0;
    bVar7 = 0;
    type.field_2._M_local_buf[0] = '\0';
    value.field_2._M_local_buf[0] = '\0';
    while (pTVar6 != (Token *)0x0) {
      if ((ulong)((long)file_tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)file_tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        print<char[60]>((char (*) [60])
                        "ERROR: Answer file doesn\'t have sufficient number of tokens");
        bVar3 = false;
        goto LAB_00109c08;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&type,file_tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
      file_tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           file_tokens.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      std::__cxx11::string::~string
                ((string *)
                 file_tokens.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&value,file_tokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1);
      file_tokens.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           file_tokens.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      std::__cxx11::string::~string
                ((string *)
                 file_tokens.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&result.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)result.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00)
      ;
      _Var2 = std::operator==(&pTVar6->value,&value);
      if (!_Var2) {
        std::__cxx11::to_string(&local_2f8,pTVar6->line_number);
        std::operator+(&local_2b8,"Error on line ",&local_2f8);
        std::operator+(&local_358,&local_2b8,",");
        std::__cxx11::to_string(&local_318,pTVar6->position_number);
        std::operator+(&local_338,&local_358,&local_318);
        std::operator+(&local_2d8,&local_338,": ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::operator+(&local_358,"Value mismatch; token value ",&pTVar6->value);
        std::operator+(&local_338,&local_358," does not match ");
        std::operator+(&local_2d8,&local_338,&value);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_358);
        bVar7 = 1;
        print<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result);
      }
      bVar3 = std::operator==(&type,*(char **)(&DAT_00115278 + (long)(int)pTVar6->type * 8));
      if (!bVar3) {
        std::__cxx11::to_string(&local_2f8,pTVar6->line_number);
        std::operator+(&local_2b8,"Error on line ",&local_2f8);
        std::operator+(&local_358,&local_2b8,",");
        std::__cxx11::to_string(&local_318,pTVar6->position_number);
        std::operator+(&local_338,&local_358,&local_318);
        std::operator+(&local_2d8,&local_338,": ");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2f8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b8,*(char **)(&DAT_00115278 + (long)(int)pTVar6->type * 8),
                   (allocator<char> *)&local_2f8);
        std::operator+(&local_358,"Type mismatch; token type ",&local_2b8);
        std::operator+(&local_338,&local_358," does not match ");
        std::operator+(&local_2d8,&local_338,&type);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_2b8);
        bVar7 = 1;
        print<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result);
      }
      pTVar6 = tokenStream::getNext(this);
      std::__cxx11::string::~string((string *)&result);
    }
    bVar3 = (bool)(bVar7 ^ 1);
LAB_00109c08:
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::string::~string((string *)&line);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&file_tokens);
  }
  std::ifstream::~ifstream(&current_stream);
  std::__cxx11::string::~string((string *)&path_to_answers);
  std::__cxx11::string::~string((string *)&p);
  return bVar3;
}

Assistant:

bool lexer_tester::test_file(string filepath) {
    po::path p(filepath);

    string path_to_answers = p.parent_path().string() + "_answers/" + p.stem().string() + ".txt";

    ifstream current_stream;
    current_stream.open(path_to_answers);

    if(!current_stream.is_open()) {
        string message = "Error: Cannot open " + path_to_answers;
        print(message);
        return false;
    }

    tokenStream *token_stream = lexer::parsefile(filepath);

    vector<string> file_tokens;

    string line;

    while(getline(current_stream,line)) {

        if(line.empty()) continue;

        vector<string> result;

        int last_comma_index = line.find_last_of(',');

        string value = line.substr(0,last_comma_index);
        string type = line.substr(last_comma_index + 1);

        boost::trim(value);
        boost::trim(type);

        file_tokens.push_back(type);
        file_tokens.push_back(value);
    }

    reverse(file_tokens.begin(), file_tokens.end());

    Token *token;
    token = token_stream->getNext();

    bool errors = false;

    string type;
    string value;

    while(token) {

        if(file_tokens.size() >= 2) {
            type = file_tokens.back();
            file_tokens.pop_back();

            value = file_tokens.back();
            file_tokens.pop_back();
        }
        else {
            print("ERROR: Answer file doesn't have sufficient number of tokens");
            return false;
        }

        string error_message;

        if(token->value != value) {
            errors = true;

            error_message = "Error on line " + to_string(token->line_number) + "," +
                                   to_string(token->position_number) + ": ";
            error_message += "Value mismatch; token value " + token->value + " does not match " + value;

            print(error_message);
        }

        if(token_type_names[(int) token->type - 1] != type) {
            errors = true;

            error_message = "Error on line " + to_string(token->line_number) + "," +
                            to_string(token->position_number) + ": ";
            error_message += "Type mismatch; token type " + string(token_type_names[(int) token->type - 1]) +
                    " does not match " + type;

            print(error_message);

        }

        token = token_stream->getNext();
    }


    return !errors;
}